

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_4cd5a1::Handlers::addParameter(Handlers *this,param_handler_t *fn)

{
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  std::function<void_(const_char_*)>::function((function<void_(const_char_*)> *)&local_48,fn);
  local_18 = (code *)0x0;
  pcStack_10 = (code *)0x0;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_28._M_unused._M_object = operator_new(0x20);
  *(undefined8 *)local_28._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_28._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_28._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_28._M_unused._0_8_ + 0x18) = uStack_30;
  if (local_38 != (code *)0x0) {
    *(void **)local_28._M_unused._0_8_ = local_48._M_unused._M_object;
    *(undefined8 *)((long)local_28._M_unused._0_8_ + 8) = local_48._8_8_;
    *(code **)((long)local_28._M_unused._0_8_ + 0x10) = local_38;
    local_38 = (code *)0x0;
    uStack_30 = 0;
  }
  pcStack_10 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:141:9)>
               ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob_json.cc:141:9)>
             ::_M_manager;
  JSONHandler::addStringHandler((JSONHandler *)this,(string_handler_t *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void
Handlers::addParameter(param_handler_t fn)
{
    jh->addStringHandler(
        [fn](std::string const& path, std::string const& parameter) { fn(parameter.c_str()); });
}